

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Matrix<double,_3,_4> * __thiscall
gl4cts::Math::outerProduct<4,3>
          (Matrix<double,_3,_4> *__return_storage_ptr__,Math *this,Vector<double,_3> *left,
          Vector<double,_4> *right)

{
  double dVar1;
  double *pdVar2;
  Matrix<double,_3,_4> local_d0;
  uint local_70;
  uint local_6c;
  GLuint i_1;
  GLuint i;
  undefined1 local_58 [8];
  Matrix<double,_1,_4> right_mat;
  Matrix<double,_3,_1> left_mat;
  Vector<double,_4> *right_local;
  Vector<double,_3> *left_local;
  Matrix<double,_3,_4> *result;
  
  tcu::Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)(right_mat.m_data.m_data + 3));
  tcu::Matrix<double,_1,_4>::Matrix((Matrix<double,_1,_4> *)local_58);
  i_1._3_1_ = 0;
  tcu::Matrix<double,_3,_4>::Matrix(__return_storage_ptr__);
  for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
    pdVar2 = tcu::Vector<double,_3>::operator[]((Vector<double,_3> *)this,local_6c);
    dVar1 = *pdVar2;
    pdVar2 = tcu::Matrix<double,_3,_1>::operator()
                       ((Matrix<double,_3,_1> *)(right_mat.m_data.m_data + 3),local_6c,0);
    *pdVar2 = dVar1;
  }
  for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
    pdVar2 = tcu::Vector<double,_4>::operator[]((Vector<double,_4> *)left,local_70);
    dVar1 = *pdVar2;
    pdVar2 = tcu::Matrix<double,_1,_4>::operator()((Matrix<double,_1,_4> *)local_58,0,local_70);
    *pdVar2 = dVar1;
  }
  tcu::operator*(&local_d0,(Matrix<double,_3,_1> *)(right_mat.m_data.m_data + 3),
                 (Matrix<double,_1,_4> *)local_58);
  tcu::Matrix<double,_3,_4>::operator=(__return_storage_ptr__,&local_d0);
  tcu::Matrix<double,_3,_4>::~Matrix(&local_d0);
  i_1._3_1_ = 1;
  tcu::Matrix<double,_1,_4>::~Matrix((Matrix<double,_1,_4> *)local_58);
  tcu::Matrix<double,_3,_1>::~Matrix((Matrix<double,_3,_1> *)(right_mat.m_data.m_data + 3));
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}